

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  bool bVar1;
  SourceCodeInfo *other;
  allocator<char> local_a1;
  string local_a0;
  int local_7c;
  undefined1 local_78 [8];
  LocationRecorder root_location;
  undefined1 local_58 [8];
  SourceCodeInfo source_code_info;
  FileDescriptorProto *file_local;
  Tokenizer *input_local;
  Parser *this_local;
  
  this->input_ = input;
  this->had_errors_ = false;
  source_code_info._40_8_ = file;
  std::__cxx11::string::clear();
  SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)local_58);
  this->source_code_info_ = (SourceCodeInfo *)local_58;
  bVar1 = LookingAtType(this,TYPE_START);
  if (bVar1) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,&this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)local_78,this);
  if (((this->require_syntax_identifier_ & 1U) != 0) || (bVar1 = LookingAt(this,"syntax"), bVar1)) {
    bVar1 = ParseSyntaxIdentifier(this);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_7c = 1;
      goto LAB_003540d6;
    }
  }
  else if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
    std::__cxx11::string::operator=((string *)&this->syntax_identifier_,"proto2");
  }
  if ((this->stop_after_syntax_identifier_ & 1U) == 0) {
    while (bVar1 = AtEnd(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = ParseTopLevelStatement
                        (this,(FileDescriptorProto *)source_code_info._40_8_,
                         (LocationRecorder *)local_78);
      if (!bVar1) {
        SkipStatement(this);
        bVar1 = LookingAt(this,"}");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"Unmatched \"}\".",&local_a1);
          AddError(this,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
          io::Tokenizer::NextWithComments
                    (this->input_,(string *)0x0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x0,&this->upcoming_doc_comments_);
        }
      }
    }
    local_7c = 0;
  }
  else {
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_7c = 1;
  }
LAB_003540d6:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_78);
  if (local_7c == 0) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    other = FileDescriptorProto::mutable_source_code_info
                      ((FileDescriptorProto *)source_code_info._40_8_);
    SourceCodeInfo::Swap((SourceCodeInfo *)local_58,other);
    this_local._7_1_ = (this->had_errors_ ^ 0xffU) & 1;
    local_7c = 1;
  }
  SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, NULL, &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier()) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
    } else if (!stop_after_syntax_identifier_) {
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, NULL, &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}